

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O1

void vera::shader(Shader *_program)

{
  col_type *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  size_t sVar9;
  double dVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  int iVar12;
  int iVar13;
  undefined8 *puVar14;
  mat4 *pmVar15;
  mat3 *_value;
  float *pfVar16;
  _Rb_tree_node_base *p_Var17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  vec4 vVar32;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  mat4 local_118;
  string local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if ((shaderPtr != fill_shader) || (shaderPtr != points_shader)) {
    shaderChange = 1;
    shaderPtr = _program;
  }
  _program->textureIndex = 0;
  Shader::use(_program);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_118.value + 1);
  local_118.value[0]._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_date","");
  vVar32 = getDate();
  Shader::setUniform(_program,(string *)&local_118,vVar32.field_0.x,vVar32.field_1.y,
                     vVar32.field_2.z,vVar32.field_3.w);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.value[0]._0_8_ != paVar3) {
    operator_delete((void *)local_118.value[0]._0_8_);
  }
  local_118.value[0]._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_resolution","");
  iVar12 = getWindowWidth();
  iVar13 = getWindowHeight();
  Shader::setUniform(_program,(string *)&local_118,(float)iVar12,(float)iVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.value[0]._0_8_ != paVar3) {
    operator_delete((void *)local_118.value[0]._0_8_);
  }
  local_118.value[0]._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_mouse","");
  fVar18 = getMouseX();
  local_b8 = CONCAT44(local_b8._4_4_,fVar18);
  fVar18 = getMouseY();
  Shader::setUniform(_program,(string *)&local_118,(float)local_b8,fVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.value[0]._0_8_ != paVar3) {
    operator_delete((void *)local_118.value[0]._0_8_);
  }
  local_118.value[0]._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_time","");
  dVar10 = getTimeSec();
  Shader::setUniform(_program,(string *)&local_118,(float)dVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.value[0]._0_8_ != paVar3) {
    operator_delete((void *)local_118.value[0]._0_8_);
  }
  local_118.value[0]._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_delta","");
  dVar10 = getDelta();
  Shader::setUniform(_program,(string *)&local_118,(float)dVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.value[0]._0_8_ != paVar3) {
    operator_delete((void *)local_118.value[0]._0_8_);
  }
  if (fill_shader == _program) {
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_color","");
    Shader::setUniform(_program,(string *)&local_118,(float)fill_color,fill_color._4_4_,DAT_00443180
                       ,DAT_00443184);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
  }
  else if (points_shader == _program) {
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_size","");
    Shader::setUniform(_program,(string *)&local_118,points_size);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_shape","");
    Shader::setUniform(_program,(string *)&local_118,points_shape);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_color","");
    Shader::setUniform(_program,(string *)&local_118,(float)fill_color,fill_color._4_4_,DAT_00443180
                       ,DAT_00443184);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    glEnable(0x8861);
    glEnable(0x8642);
  }
  if (*(long *)(scene + 0x1f0) == 0) {
    paVar2 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"u_modelViewProjectionMatrix","");
    pmVar15 = getFlippedOrthoMatrix();
    local_78._0_4_ = pmVar15->value[0].field_0;
    local_78._4_4_ = pmVar15->value[0].field_1;
    uStack_70 = 0;
    local_68._0_4_ = pmVar15->value[0].field_2;
    local_68._4_4_ = pmVar15->value[0].field_3;
    local_b8._0_4_ = *(float *)&pmVar15->value[1].field_0;
    local_b8._4_4_ = pmVar15->value[1].field_1;
    uStack_b0 = 0;
    local_88._0_4_ = pmVar15->value[1].field_2;
    local_88._4_4_ = pmVar15->value[1].field_3;
    local_98._0_4_ = pmVar15->value[2].field_0;
    local_98._4_4_ = pmVar15->value[2].field_1;
    uStack_60 = 0;
    uStack_80 = 0;
    uStack_90 = 0;
    local_a8._0_4_ = pmVar15->value[2].field_2;
    local_a8._4_4_ = pmVar15->value[2].field_3;
    uStack_a0 = 0;
    uVar4 = pmVar15->value[3].field_0;
    uVar6 = pmVar15->value[3].field_1;
    local_118.value[0].field_0.x =
         (float)uVar4 * DAT_004431d4._4_4_ +
         (float)(undefined4)local_98 * (float)DAT_004431d4 +
         (float)local_b8 * matrix_world._4_4_ + (float)(undefined4)local_78 * (float)matrix_world;
    local_118.value[0].field_1.y =
         (float)uVar6 * DAT_004431d4._4_4_ +
         (float)local_98._4_4_ * (float)DAT_004431d4 +
         (float)local_b8._4_4_ * matrix_world._4_4_ + (float)local_78._4_4_ * (float)matrix_world;
    uVar5 = pmVar15->value[3].field_2;
    uVar7 = pmVar15->value[3].field_3;
    local_118.value[0].field_2.z =
         (float)uVar5 * DAT_004431d4._4_4_ +
         (float)(undefined4)local_a8 * (float)DAT_004431d4 +
         (float)(undefined4)local_88 * matrix_world._4_4_ +
         (float)(undefined4)local_68 * (float)matrix_world;
    local_118.value[0].field_3.w =
         DAT_004431d4._4_4_ * (float)uVar7 +
         (float)DAT_004431d4 * (float)local_a8._4_4_ +
         matrix_world._4_4_ * (float)local_88._4_4_ + (float)matrix_world * (float)local_68._4_4_;
    local_118.value[1].field_0.x =
         (float)uVar4 * DAT_004431e4._4_4_ +
         (float)(undefined4)local_98 * (float)DAT_004431e4 +
         (float)local_b8 * DAT_004431dc._4_4_ + (float)(undefined4)local_78 * (float)DAT_004431dc;
    local_118.value[1].field_1.y =
         (float)uVar6 * DAT_004431e4._4_4_ +
         (float)local_98._4_4_ * (float)DAT_004431e4 +
         (float)local_b8._4_4_ * DAT_004431dc._4_4_ + (float)local_78._4_4_ * (float)DAT_004431dc;
    local_118.value[1].field_3.w =
         DAT_004431e4._4_4_ * (float)uVar7 +
         (float)DAT_004431e4 * (float)local_a8._4_4_ +
         DAT_004431dc._4_4_ * (float)local_88._4_4_ + (float)DAT_004431dc * (float)local_68._4_4_;
    local_118.value[1].field_2.z =
         (float)uVar5 * DAT_004431e4._4_4_ +
         (float)(undefined4)local_a8 * (float)DAT_004431e4 +
         (float)(undefined4)local_88 * DAT_004431dc._4_4_ +
         (float)(undefined4)local_68 * (float)DAT_004431dc;
    local_118.value[2].field_2.z =
         (float)uVar5 * DAT_004431f4._4_4_ +
         (float)(undefined4)local_a8 * (float)DAT_004431f4 +
         (float)(undefined4)local_88 * DAT_004431ec._4_4_ +
         (float)(undefined4)local_68 * (float)DAT_004431ec;
    local_118.value[2].field_1.y =
         (float)uVar6 * DAT_004431f4._4_4_ +
         (float)local_98._4_4_ * (float)DAT_004431f4 +
         (float)local_b8._4_4_ * DAT_004431ec._4_4_ + (float)local_78._4_4_ * (float)DAT_004431ec;
    local_118.value[2].field_0.x =
         (float)uVar4 * DAT_004431f4._4_4_ +
         (float)(undefined4)local_98 * (float)DAT_004431f4 +
         (float)local_b8 * DAT_004431ec._4_4_ + (float)(undefined4)local_78 * (float)DAT_004431ec;
    local_118.value[3].field_3.w =
         (float)uVar7 * DAT_00443204._4_4_ +
         (float)local_a8._4_4_ * (float)DAT_00443204 +
         (float)local_88._4_4_ * DAT_004431fc._4_4_ + (float)local_68._4_4_ * (float)DAT_004431fc;
    local_118.value[3].field_0.x =
         (float)uVar4 * DAT_00443204._4_4_ +
         (float)(undefined4)local_98 * (float)DAT_00443204 +
         (float)local_b8 * DAT_004431fc._4_4_ + (float)(undefined4)local_78 * (float)DAT_004431fc;
    local_118.value[2].field_3.w =
         DAT_004431f4._4_4_ * (float)uVar7 +
         (float)DAT_004431f4 * (float)local_a8._4_4_ +
         DAT_004431ec._4_4_ * (float)local_88._4_4_ + (float)DAT_004431ec * (float)local_68._4_4_;
    local_118.value[3].field_2.z =
         (float)uVar5 * DAT_00443204._4_4_ +
         (float)(undefined4)local_a8 * (float)DAT_00443204 +
         (float)(undefined4)local_88 * DAT_004431fc._4_4_ +
         (float)(undefined4)local_68 * (float)DAT_004431fc;
    local_118.value[3].field_1.y =
         (float)uVar6 * DAT_00443204._4_4_ +
         (float)local_98._4_4_ * (float)DAT_00443204 +
         (float)local_b8._4_4_ * DAT_004431fc._4_4_ + (float)local_78._4_4_ * (float)DAT_004431fc;
    local_58 = (float)local_78._4_4_;
    fStack_54 = (float)local_78._4_4_;
    fStack_50 = (float)local_78._4_4_;
    fStack_4c = (float)local_78._4_4_;
    local_48 = (float)local_68._4_4_;
    fStack_44 = (float)local_68._4_4_;
    fStack_40 = (float)local_68._4_4_;
    fStack_3c = (float)local_68._4_4_;
    Shader::setUniform(_program,&local_d8,&local_118,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_projectionMatrix","");
    pmVar15 = getFlippedOrthoMatrix();
    Shader::setUniform(_program,(string *)&local_118,pmVar15,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"u_viewMatrix","");
    local_118.value[0].field_0.x = 1.0;
    local_118.value[0].field_1.y = 0.0;
    local_118.value[0].field_2.z = 0.0;
    local_118.value[0].field_3.w = 0.0;
    local_118.value[1].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0
    ;
    local_118.value[1].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3f800000;
    local_118.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0
    ;
    local_118.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0
    ;
    local_118.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0
    ;
    local_118.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0
    ;
    local_118.value[2].field_2.z = 1.0;
    local_118.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0
    ;
    local_118.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0
    ;
    local_118.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0
    ;
    local_118.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0
    ;
    local_118.value[3].field_3.w = 1.0;
    Shader::setUniform(_program,&local_d8,&local_118,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"u_normalMatrix","");
    local_118.value[0].field_0.x = 1.0;
    local_118.value[0].field_1.y = 0.0;
    local_118.value[0].field_2.z = 0.0;
    local_118.value[0].field_3.w = 0.0;
    local_118.value[1].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x3f800000;
    local_118.value[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0
    ;
    local_118.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0
    ;
    local_118.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0
    ;
    local_118.value[2].field_0.x = 1.0;
    Shader::setUniform(_program,&local_d8,(mat3 *)&local_118,false);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_118.value[0].field_1,local_118.value[0].field_0);
    local_118.value[0]._0_8_ = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == paVar2) goto LAB_00209c06;
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"u_modelViewProjectionMatrix","");
    puVar14 = (undefined8 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2d0))();
    local_78 = *puVar14;
    fVar20 = (float)local_78;
    local_58 = (float)((ulong)local_78 >> 0x20);
    uStack_70 = 0;
    local_68 = puVar14[1];
    fVar23 = (float)local_68;
    local_48 = (float)((ulong)local_68 >> 0x20);
    local_b8 = puVar14[2];
    fVar26 = (float)local_b8;
    fVar27 = (float)((ulong)local_b8 >> 0x20);
    uStack_b0 = 0;
    local_88 = puVar14[3];
    fVar24 = (float)local_88;
    fVar25 = (float)((ulong)local_88 >> 0x20);
    local_98 = puVar14[4];
    fVar21 = (float)local_98;
    fVar22 = (float)((ulong)local_98 >> 0x20);
    uStack_60 = 0;
    uStack_80 = 0;
    uStack_90 = 0;
    local_a8 = puVar14[5];
    fVar18 = (float)local_a8;
    fVar19 = (float)((ulong)local_a8 >> 0x20);
    uStack_a0 = 0;
    fVar28 = (float)puVar14[6];
    fVar29 = (float)((ulong)puVar14[6] >> 0x20);
    local_118.value[0].field_0.x =
         fVar28 * DAT_004431d4._4_4_ +
         fVar21 * (float)DAT_004431d4 + fVar26 * matrix_world._4_4_ + fVar20 * (float)matrix_world;
    local_118.value[0].field_1.y =
         fVar29 * DAT_004431d4._4_4_ +
         fVar22 * (float)DAT_004431d4 + fVar27 * matrix_world._4_4_ + local_58 * (float)matrix_world
    ;
    fVar30 = (float)puVar14[7];
    local_118.value[0].field_2.z =
         fVar30 * DAT_004431d4._4_4_ +
         fVar18 * (float)DAT_004431d4 + fVar24 * matrix_world._4_4_ + fVar23 * (float)matrix_world;
    fVar31 = (float)((ulong)puVar14[7] >> 0x20);
    local_118.value[0].field_3.w =
         DAT_004431d4._4_4_ * fVar31 +
         (float)DAT_004431d4 * fVar19 + matrix_world._4_4_ * fVar25 + (float)matrix_world * local_48
    ;
    local_118.value[1].field_0.x =
         fVar28 * DAT_004431e4._4_4_ +
         fVar21 * (float)DAT_004431e4 + fVar26 * DAT_004431dc._4_4_ + fVar20 * (float)DAT_004431dc;
    local_118.value[1].field_1.y =
         fVar29 * DAT_004431e4._4_4_ +
         fVar22 * (float)DAT_004431e4 + fVar27 * DAT_004431dc._4_4_ + local_58 * (float)DAT_004431dc
    ;
    local_118.value[1].field_3.w =
         DAT_004431e4._4_4_ * fVar31 +
         (float)DAT_004431e4 * fVar19 + DAT_004431dc._4_4_ * fVar25 + (float)DAT_004431dc * local_48
    ;
    local_118.value[1].field_2.z =
         fVar30 * DAT_004431e4._4_4_ +
         fVar18 * (float)DAT_004431e4 + fVar24 * DAT_004431dc._4_4_ + fVar23 * (float)DAT_004431dc;
    local_118.value[2].field_2.z =
         fVar30 * DAT_004431f4._4_4_ +
         fVar18 * (float)DAT_004431f4 + fVar24 * DAT_004431ec._4_4_ + fVar23 * (float)DAT_004431ec;
    local_118.value[2].field_1.y =
         fVar29 * DAT_004431f4._4_4_ +
         fVar22 * (float)DAT_004431f4 + fVar27 * DAT_004431ec._4_4_ + local_58 * (float)DAT_004431ec
    ;
    local_118.value[2].field_0.x =
         fVar28 * DAT_004431f4._4_4_ +
         fVar21 * (float)DAT_004431f4 + fVar26 * DAT_004431ec._4_4_ + fVar20 * (float)DAT_004431ec;
    local_118.value[3].field_3.w =
         fVar31 * DAT_00443204._4_4_ +
         fVar19 * (float)DAT_00443204 + fVar25 * DAT_004431fc._4_4_ + local_48 * (float)DAT_004431fc
    ;
    local_118.value[3].field_0.x =
         fVar28 * DAT_00443204._4_4_ +
         fVar21 * (float)DAT_00443204 + fVar26 * DAT_004431fc._4_4_ + fVar20 * (float)DAT_004431fc;
    local_118.value[2].field_3.w =
         DAT_004431f4._4_4_ * fVar31 +
         (float)DAT_004431f4 * fVar19 + DAT_004431ec._4_4_ * fVar25 + (float)DAT_004431ec * local_48
    ;
    local_118.value[3].field_2.z =
         fVar30 * DAT_00443204._4_4_ +
         fVar18 * (float)DAT_00443204 + fVar24 * DAT_004431fc._4_4_ + fVar23 * (float)DAT_004431fc;
    local_118.value[3].field_1.y =
         fVar29 * DAT_00443204._4_4_ +
         fVar22 * (float)DAT_00443204 + fVar27 * DAT_004431fc._4_4_ + local_58 * (float)DAT_004431fc
    ;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    Shader::setUniform(_program,&local_d8,&local_118,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_projectionMatrix","");
    pmVar15 = (mat4 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2c8))();
    Shader::setUniform(_program,(string *)&local_118,pmVar15,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_normalMatrix","");
    _value = (mat3 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2b8))();
    Shader::setUniform(_program,(string *)&local_118,_value,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_viewMatrix","");
    pmVar15 = (mat4 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2b0))();
    Shader::setUniform(_program,(string *)&local_118,pmVar15,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_camera","");
    pfVar16 = (float *)(**(code **)(**(long **)(scene + 0x1f0) + 0x98))();
    Shader::setUniform(_program,(string *)&local_118,-*pfVar16,-pfVar16[1],-pfVar16[2]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_cameraDistance","");
    fVar18 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x278))();
    Shader::setUniform(_program,(string *)&local_118,fVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_cameraNearClip","");
    fVar18 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x270))();
    Shader::setUniform(_program,(string *)&local_118,fVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_cameraFarClip","");
    fVar18 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x268))();
    Shader::setUniform(_program,(string *)&local_118,fVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_cameraEv100","");
    fVar18 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x280))();
    Shader::setUniform(_program,(string *)&local_118,fVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_cameraExposure","");
    dVar10 = (double)(**(code **)(**(long **)(scene + 0x1f0) + 0x288))();
    Shader::setUniform(_program,(string *)&local_118,(float)dVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_cameraAperture","");
    fVar18 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x290))();
    Shader::setUniform(_program,(string *)&local_118,fVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_cameraShutterSpeed","");
    fVar18 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x298))();
    Shader::setUniform(_program,(string *)&local_118,fVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_cameraSensitivity","");
    fVar18 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x2a0))();
    Shader::setUniform(_program,(string *)&local_118,fVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_cameraChange","");
    Shader::setUniform(_program,(string *)&local_118,
                       (uint)*(byte *)(*(long *)(scene + 0x1f0) + 0x20));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ != paVar3) {
      operator_delete((void *)local_118.value[0]._0_8_);
    }
    local_118.value[0]._0_8_ = paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_iblLuminance","");
    dVar10 = (double)(**(code **)(**(long **)(scene + 0x1f0) + 0x288))();
    Shader::setUniform(_program,(string *)&local_118,(float)(dVar10 * 30000.0));
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.value[0]._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.value[0]._0_8_ == paVar3) goto LAB_00209c06;
  }
  operator_delete((void *)local_118.value[0]._0_8_);
  local_118.value[0]._0_8_ = paVar11;
LAB_00209c06:
  local_118.value[0]._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_modelMatrix","");
  Shader::setUniform(_program,(string *)&local_118,(mat4 *)&matrix_world,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.value[0]._0_8_ != paVar3) {
    operator_delete((void *)local_118.value[0]._0_8_);
  }
  if (lights_enabled == '\x01') {
    p_Var17 = *(_Rb_tree_node_base **)(scene + 0xe0);
    if (*(long *)(scene + 0xf0) == 1) {
      pcVar1 = local_118.value + 1;
      local_118.value[0]._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_lightColor","");
      lVar8 = *(long *)(p_Var17 + 2);
      Shader::setUniform(_program,(string *)&local_118,*(float *)(lVar8 + 0xb0),
                         *(float *)(lVar8 + 0xb4),*(float *)(lVar8 + 0xb8));
      if ((col_type *)local_118.value[0]._0_8_ != pcVar1) {
        operator_delete((void *)local_118.value[0]._0_8_);
      }
      local_118.value[0]._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_lightIntensity","");
      Shader::setUniform(_program,(string *)&local_118,*(float *)(*(long *)(p_Var17 + 2) + 200));
      if ((col_type *)local_118.value[0]._0_8_ != pcVar1) {
        operator_delete((void *)local_118.value[0]._0_8_);
      }
      local_118.value[0]._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_light","");
      pfVar16 = (float *)(**(code **)(**(long **)(p_Var17 + 2) + 0x98))();
      Shader::setUniform(_program,(string *)&local_118,*pfVar16,pfVar16[1],pfVar16[2]);
      if ((col_type *)local_118.value[0]._0_8_ != pcVar1) {
        operator_delete((void *)local_118.value[0]._0_8_);
      }
      if ((*(uint *)(*(long *)(p_Var17 + 2) + 0x210) & 0xfffffffd) == 0) {
        local_118.value[0]._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_lightDirection","");
        lVar8 = *(long *)(p_Var17 + 2);
        Shader::setUniform(_program,(string *)&local_118,*(float *)(lVar8 + 0xbc),
                           *(float *)(lVar8 + 0xc0),*(float *)(lVar8 + 0xc4));
        if ((col_type *)local_118.value[0]._0_8_ != pcVar1) {
          operator_delete((void *)local_118.value[0]._0_8_);
        }
      }
      if (0.0 < *(float *)(*(long *)(p_Var17 + 2) + 0xcc)) {
        local_118.value[0]._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_lightFalloff","");
        Shader::setUniform(_program,(string *)&local_118,*(float *)(*(long *)(p_Var17 + 2) + 0xcc));
        if ((col_type *)local_118.value[0]._0_8_ != pcVar1) {
          operator_delete((void *)local_118.value[0]._0_8_);
        }
      }
      local_118.value[0]._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_lightMatrix","");
      Shader::setUniform(_program,(string *)&local_118,(mat4 *)(*(long *)(p_Var17 + 2) + 0x1c8),
                         false);
      if ((col_type *)local_118.value[0]._0_8_ != pcVar1) {
        operator_delete((void *)local_118.value[0]._0_8_);
      }
      if (*(char *)(*(long *)(p_Var17 + 2) + 0x100) == '\x01') {
        local_118.value[0]._0_8_ = local_118.value + 1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u_lightShadowMap","");
        lVar8 = *(long *)(p_Var17 + 2);
        sVar9 = _program->textureIndex;
        _program->textureIndex = sVar9 + 1;
        Shader::setUniformDepthTexture(_program,(string *)&local_118,(Fbo *)(lVar8 + 0xd0),sVar9);
        if ((col_type *)local_118.value[0]._0_8_ != local_118.value + 1) {
          operator_delete((void *)local_118.value[0]._0_8_);
        }
      }
    }
    else if (p_Var17 != (_Rb_tree_node_base *)(scene + 0xd0)) {
      paVar3 = &local_d8.field_2;
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_118,"u_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var17 + 1));
        local_d8._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_118.value[0]._0_8_,
                   (char *)(local_118.value[0]._0_8_ +
                           CONCAT44(local_118.value[0].field_3,local_118.value[0].field_2)));
        std::__cxx11::string::append((char *)&local_d8);
        lVar8 = *(long *)(p_Var17 + 2);
        Shader::setUniform(_program,&local_d8,*(float *)(lVar8 + 0xb0),*(float *)(lVar8 + 0xb4),
                           *(float *)(lVar8 + 0xb8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar3) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        local_d8._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_118.value[0]._0_8_,
                   (char *)(local_118.value[0]._0_8_ +
                           CONCAT44(local_118.value[0].field_3,local_118.value[0].field_2)));
        std::__cxx11::string::append((char *)&local_d8);
        Shader::setUniform(_program,&local_d8,*(float *)(*(long *)(p_Var17 + 2) + 200));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar3) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if ((int)(*(long **)(p_Var17 + 2))[0x42] != 0) {
          pfVar16 = (float *)(**(code **)(**(long **)(p_Var17 + 2) + 0x98))();
          Shader::setUniform(_program,(string *)&local_118,*pfVar16,pfVar16[1],pfVar16[2]);
        }
        if ((*(uint *)(*(long *)(p_Var17 + 2) + 0x210) & 0xfffffffd) == 0) {
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_118.value[0]._0_8_,
                     (char *)(local_118.value[0]._0_8_ +
                             CONCAT44(local_118.value[0].field_3,local_118.value[0].field_2)));
          std::__cxx11::string::append((char *)&local_d8);
          lVar8 = *(long *)(p_Var17 + 2);
          Shader::setUniform(_program,&local_d8,*(float *)(lVar8 + 0xbc),*(float *)(lVar8 + 0xc0),
                             *(float *)(lVar8 + 0xc4));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
        }
        if (0.0 < *(float *)(*(long *)(p_Var17 + 2) + 0xcc)) {
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_118.value[0]._0_8_,
                     (char *)(local_118.value[0]._0_8_ +
                             CONCAT44(local_118.value[0].field_3,local_118.value[0].field_2)));
          std::__cxx11::string::append((char *)&local_d8);
          Shader::setUniform(_program,&local_d8,*(float *)(*(long *)(p_Var17 + 2) + 0xcc));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
        }
        local_d8._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_118.value[0]._0_8_,
                   (char *)(local_118.value[0]._0_8_ +
                           CONCAT44(local_118.value[0].field_3,local_118.value[0].field_2)));
        std::__cxx11::string::append((char *)&local_d8);
        Shader::setUniform(_program,&local_d8,(mat4 *)(*(long *)(p_Var17 + 2) + 0x1c8),false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar3) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if (*(char *)(*(long *)(p_Var17 + 2) + 0x100) == '\x01') {
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_118.value[0]._0_8_,
                     (char *)(local_118.value[0]._0_8_ +
                             CONCAT44(local_118.value[0].field_3,local_118.value[0].field_2)));
          std::__cxx11::string::append((char *)&local_d8);
          lVar8 = *(long *)(p_Var17 + 2);
          sVar9 = _program->textureIndex;
          _program->textureIndex = sVar9 + 1;
          Shader::setUniformDepthTexture(_program,&local_d8,(Fbo *)(lVar8 + 0xd0),sVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
        }
        if ((col_type *)local_118.value[0]._0_8_ != local_118.value + 1) {
          operator_delete((void *)local_118.value[0]._0_8_);
        }
        p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
      } while (p_Var17 != (_Rb_tree_node_base *)(scene + 0xd0));
    }
  }
  return;
}

Assistant:

void shader(Shader* _program) {
    if (shaderPtr != fill_shader || shaderPtr != points_shader) {
        shaderPtr = _program; 
        shaderChange = true;
    }

    _program->textureIndex = 0;
    _program->use();

    _program->setUniform("u_date", getDate() );
    _program->setUniform("u_resolution", (float)getWindowWidth(), (float)getWindowHeight() );
    _program->setUniform("u_mouse", (float)getMouseX(), (float)getMouseY() );
    _program->setUniform("u_time", (float)getTimeSec() );
    _program->setUniform("u_delta", (float)getDelta() );

    if (_program == fill_shader)
        _program->setUniform("u_color", fill_color);
    else if (_program == points_shader) {
        _program->setUniform("u_size", points_size);
        _program->setUniform("u_shape", points_shape);
        _program->setUniform("u_color", fill_color);
        #if !defined(PLATFORM_RPI) && !defined(DRIVER_GBM) && !defined(_WIN32) && !defined(__EMSCRIPTEN__)
        glEnable(GL_POINT_SPRITE);
        glEnable(GL_VERTEX_PROGRAM_POINT_SIZE);
        #endif
    }

    if (scene->activeCamera) {
        _program->setUniform("u_modelViewProjectionMatrix", scene->activeCamera->getProjectionViewMatrix() * matrix_world );
        _program->setUniform("u_projectionMatrix", scene->activeCamera->getProjectionMatrix());
        _program->setUniform("u_normalMatrix", scene->activeCamera->getNormalMatrix());
        _program->setUniform("u_viewMatrix", scene->activeCamera->getViewMatrix() );

        _program->setUniform("u_camera", -scene->activeCamera->getPosition() );
        _program->setUniform("u_cameraDistance", scene->activeCamera->getDistance());
        _program->setUniform("u_cameraNearClip", scene->activeCamera->getNearClip());
        _program->setUniform("u_cameraFarClip", scene->activeCamera->getFarClip());
        _program->setUniform("u_cameraEv100", scene->activeCamera->getEv100());
        _program->setUniform("u_cameraExposure", float(scene->activeCamera->getExposure()));
        _program->setUniform("u_cameraAperture", scene->activeCamera->getAperture());
        _program->setUniform("u_cameraShutterSpeed", scene->activeCamera->getShutterSpeed());
        _program->setUniform("u_cameraSensitivity", scene->activeCamera->getSensitivity());
        _program->setUniform("u_cameraChange", scene->activeCamera->bChange);
        _program->setUniform("u_iblLuminance", float(30000.0f * scene->activeCamera->getExposure()));
    }
    else {
        _program->setUniform("u_modelViewProjectionMatrix", getFlippedOrthoMatrix() * matrix_world );
        _program->setUniform("u_projectionMatrix", getFlippedOrthoMatrix() );
        _program->setUniform("u_viewMatrix", glm::mat4(1.0f) );
        _program->setUniform("u_normalMatrix", glm::mat3(1.0f) );
    }

    _program->setUniform("u_modelMatrix", matrix_world );

    if (lights_enabled) {
        // Pass Light Uniforms
        if (scene->lights.size() == 1) {
            LightsMap::iterator it = scene->lights.begin();

            _program->setUniform("u_lightColor", it->second->color);
            _program->setUniform("u_lightIntensity", it->second->intensity);

            // if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
            _program->setUniform("u_light", it->second->getPosition());
            if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                _program->setUniform("u_lightDirection", it->second->direction);
            if (it->second->falloff > 0)
                _program->setUniform("u_lightFalloff", it->second->falloff);

            _program->setUniform("u_lightMatrix", it->second->getBiasMVPMatrix() );

            if (it->second->getShadowMap()->isAllocated())
                _program->setUniformDepthTexture("u_lightShadowMap", it->second->getShadowMap(), _program->textureIndex++ );
        }
        else {
            for (LightsMap::iterator it = scene->lights.begin(); it != scene->lights.end(); ++it) {
                std::string name = "u_" + it->first;

                _program->setUniform(name + "Color", it->second->color);
                _program->setUniform(name + "Intensity", it->second->intensity);
                if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
                    _program->setUniform(name, it->second->getPosition());
                if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                    _program->setUniform(name + "Direction", it->second->direction);
                if (it->second->falloff > 0)
                    _program->setUniform(name +"Falloff", it->second->falloff);

                _program->setUniform(name + "Matrix", it->second->getBiasMVPMatrix() );

                if (it->second->getShadowMap()->isAllocated())
                    _program->setUniformDepthTexture(name + "ShadowMap", it->second->getShadowMap(), _program->textureIndex++ );
            }
        } 
    }
}